

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoButton_File
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  long lVar1;
  int iVar2;
  CUI *pCVar3;
  void *pvVar4;
  int in_ECX;
  char *in_RDX;
  void *in_RSI;
  CEditor *in_RDI;
  CUI *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  vec4 vVar5;
  CUIRect Label;
  CUIRect *in_stack_ffffffffffffff68;
  float Cut;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  CUI *in_stack_ffffffffffffff80;
  CUI *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined8 local_38;
  void *pvStack_30;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffd8;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_ffffffffffffffdc;
  vec4 *in_stack_ffffffffffffffe0;
  CUIRect *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX == 0) {
    pCVar3 = UI(in_RDI);
    pvVar4 = CUI::HotItem(pCVar3);
    pCVar3 = in_R8;
    if (pvVar4 == in_RSI) {
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&stack0xffffffffffffffd8,1.0,1.0,1.0,0.33);
      CUIRect::Draw(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc.y,
                    (int)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffff80 = in_R8;
    }
  }
  else {
    pCVar3 = in_R8;
    vVar5 = GetButtonColor((CEditor *)CONCAT44(in_R9D,in_stack_ffffffffffffff98),in_RDI,
                           (int)((ulong)in_R8 >> 0x20));
    CUIRect::Draw(vVar5._0_8_,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc.y,
                  (int)in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffff88 = in_R8;
  }
  local_38 = *(undefined8 *)pCVar3;
  pvStack_30 = pCVar3->m_pHotItem;
  Cut = (float)((ulong)&local_38 >> 0x20);
  CUIRect::VMargin((CUIRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),Cut,
                   in_stack_ffffffffffffff68);
  UI(in_RDI);
  CUI::DoLabel(pCVar3,(CUIRect *)CONCAT44(in_R9D,in_stack_ffffffffffffff98),(char *)in_RDI,
               (float)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
               (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0));
  iVar2 = DoButton_Editor_Common
                    ((CEditor *)CONCAT44(in_R9D,in_stack_ffffffffffffff98),in_RDI,
                     &in_stack_ffffffffffffff88->m_Enabled,
                     (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                     (CUIRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)Cut,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int CEditor::DoButton_File(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	if(Checked)
		pRect->Draw(GetButtonColor(pID, Checked), 3.0f);
	else if(UI()->HotItem() == pID)
		pRect->Draw(vec4(1,1,1,0.33f), 3.0f);

	CUIRect Label = *pRect;
	Label.VMargin(5.0f, &Label);
	UI()->DoLabel(&Label, pText, 10.0f, TEXTALIGN_ML);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}